

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_socket_raw(nng_socket id,_Bool *rawp)

{
  _Bool _Var1;
  nni_sock *local_28;
  nni_sock *sock;
  _Bool *p_Stack_18;
  int rv;
  _Bool *rawp_local;
  nng_socket id_local;
  
  p_Stack_18 = rawp;
  rawp_local._0_4_ = id.id;
  sock._4_4_ = nni_sock_find(&local_28,id.id);
  rawp_local._4_4_ = sock._4_4_;
  if (sock._4_4_ == 0) {
    _Var1 = nni_sock_raw(local_28);
    *p_Stack_18 = _Var1;
    nni_sock_rele(local_28);
    rawp_local._4_4_ = 0;
  }
  return rawp_local._4_4_;
}

Assistant:

int
nng_socket_raw(nng_socket id, bool *rawp)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, id.id)) != 0) {
		return (rv);
	}
	*rawp = nni_sock_raw(sock);
	nni_sock_rele(sock);
	return (0);
}